

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.c
# Opt level: O3

void DumpString(TString *s,DumpState *D)

{
  TString *b;
  size_t size_00;
  lu_byte x_2;
  lu_byte x;
  lu_byte x_1;
  size_t size;
  undefined1 local_23;
  undefined1 local_22;
  undefined1 local_21;
  ulong local_20;
  
  if (s == (TString *)0x0) {
    b = (TString *)&local_23;
    size_00 = 1;
    local_23 = 0;
  }
  else {
    if (s->tt == '\x04') {
      size_00 = (size_t)s->shrlen;
    }
    else {
      size_00 = (s->u).lnglen;
    }
    local_20 = size_00 + 1;
    b = s + 1;
    if (local_20 < 0xff) {
      local_22 = (undefined1)local_20;
      DumpBlock(&local_22,1,D);
    }
    else {
      local_21 = 0xff;
      DumpBlock(&local_21,1,D);
      DumpBlock(&local_20,8,D);
      size_00 = local_20 - 1;
    }
  }
  DumpBlock(b,size_00,D);
  return;
}

Assistant:

static void DumpString (const TString *s, DumpState *D) {
  if (s == NULL)
    DumpByte(0, D);
  else {
    size_t size = tsslen(s) + 1;  /* include trailing '\0' */
    const char *str = getstr(s);
    if (size < 0xFF)
      DumpByte(cast_int(size), D);
    else {
      DumpByte(0xFF, D);
      DumpVar(size, D);
    }
    DumpVector(str, size - 1, D);  /* no need to save '\0' */
  }
}